

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O2

int cuddTestInteract(DdManager *table,int x,int y)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = y;
  if (y < x) {
    iVar1 = x;
  }
  if (x < y) {
    y = x;
  }
  uVar2 = ((((table->size * 2 - y) + -3) * y >> 1) + iVar1) - 1;
  return (int)(((ulong)table->interact[(int)uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0);
}

Assistant:

int
cuddTestInteract(
  DdManager * table,
  int  x,
  int  y)
{
    int posn, word, bit, result;

    if (x > y) {
        int tmp = x;
        x = y;
        y = tmp;
    }
#ifdef DD_DEBUG
    assert(x < y);
    assert(y < table->size);
    assert(x >= 0);
#endif

    posn = ((((table->size << 1) - x - 3) * x) >> 1) + y - 1;
    word = posn >> LOGBPL;
    bit = posn & (BPL-1);
    result = (table->interact[word] >> bit) & 1L;
    return(result);

}